

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

void Memory::
     DeleteArray<Memory::HeapAllocator,TTD::TTDIdentifierDictionary<unsigned_long,int>::Entry>
               (AllocatorType *allocator,size_t count,Entry *obj)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t byteSize;
  
  if (count == 0) {
    byteSize = 0;
  }
  else {
    byteSize = count << 4;
    if (byteSize / count != 0x10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x195,"(count * sizeof(T) / count == sizeof(T))",
                         "count * sizeof(T) / count == sizeof(T)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  HeapAllocator::Free(allocator,obj,byteSize);
  return;
}

Assistant:

void DeleteArray(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, size_t count, T * obj)
{
    if (count == 0 && AllocatorInfo<TAllocator, T>::AllocatorType::FakeZeroLengthArray)
    {
        return;
    }

    if (count != 0)
    {
        DestructArray(count, obj);

        // DeleteArray can only be called when an array is allocated successfully.
        // So the add should never overflow
        Assert(count * sizeof(T) / count == sizeof(T));
    }

    auto freeFunc = AllocatorInfo<TAllocator, T>::AllocatorFunc::GetFreeFunc();
    (allocator->*freeFunc)((void *)obj, sizeof(T) * count);
}